

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitDestructuredElement
               (ParseNode *elem,RegSlot sourceLocation,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  undefined1 *puVar1;
  ParseNodeVar *pPVar2;
  
  if ((byte)(elem->nop + ~knopList) < 3) {
    pPVar2 = ParseNode::AsParseNodeVar(elem);
    puVar1 = &pPVar2->sym->field_0x42;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfffe;
  }
  else {
    EmitReference(elem,byteCodeGenerator,funcInfo);
  }
  EmitAssignment((ParseNode *)0x0,elem,sourceLocation,byteCodeGenerator,funcInfo);
  FuncInfo::ReleaseReference(funcInfo,elem);
  return;
}

Assistant:

void EmitDestructuredElement(ParseNode *elem, Js::RegSlot sourceLocation, ByteCodeGenerator* byteCodeGenerator, FuncInfo *funcInfo)
{
    switch (elem->nop)
    {
    case knopVarDecl:
    case knopLetDecl:
    case knopConstDecl:
        // We manually need to set NeedDeclaration since the node won't be visited.
        elem->AsParseNodeVar()->sym->SetNeedDeclaration(false);
        break;

    default:
        EmitReference(elem, byteCodeGenerator, funcInfo);
    }

    EmitAssignment(nullptr, elem, sourceLocation, byteCodeGenerator, funcInfo);
    funcInfo->ReleaseReference(elem);
}